

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv_reader.hpp
# Opt level: O0

void __thiscall csv::CSVReader::~CSVReader(CSVReader *this)

{
  bool bVar1;
  CSVReader *this_local;
  
  bVar1 = std::thread::joinable(&this->read_csv_worker);
  if (bVar1) {
    std::thread::join();
  }
  std::thread::~thread(&this->read_csv_worker);
  std::
  unique_ptr<csv::internals::ThreadSafeDeque<csv::CSVRow>,_std::default_delete<csv::internals::ThreadSafeDeque<csv::CSVRow>_>_>
  ::~unique_ptr(&this->records);
  std::
  unique_ptr<csv::internals::IBasicCSVParser,_std::default_delete<csv::internals::IBasicCSVParser>_>
  ::~unique_ptr(&this->parser);
  std::shared_ptr<csv::internals::ColNames>::~shared_ptr(&this->col_names);
  CSVFormat::~CSVFormat(&this->_format);
  return;
}

Assistant:

~CSVReader() {
            if (this->read_csv_worker.joinable()) {
                this->read_csv_worker.join();
            }
        }